

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * MeCab::create_filename(string *path,string *file)

{
  long lVar1;
  char *pcVar2;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *s;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    std::__cxx11::string::size();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    if (*pcVar2 != '/') {
      std::__cxx11::string::operator+=(in_RDI,'/');
    }
  }
  std::__cxx11::string::operator+=(in_RDI,in_RDX);
  return in_RDI;
}

Assistant:

std::string create_filename(const std::string &path,
                            const std::string &file) {
  std::string s = path;
#if defined(_WIN32) && !defined(__CYGWIN__)
  if (s.size() && s[s.size()-1] != '\\') s += '\\';
#else
  if (s.size() && s[s.size()-1] != '/') s += '/';
#endif
  s += file;
  return s;
}